

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc_utils.c
# Opt level: O0

char * lrtr_strdup(char *string)

{
  long lVar1;
  size_t sVar2;
  long in_FS_OFFSET;
  char *local_30;
  char *new_string;
  size_t length;
  char *string_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (string == (char *)0x0) {
    __assert_fail("string",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/lib/alloc_utils.c"
                  ,0x4a,"char *lrtr_strdup(const char *)");
  }
  sVar2 = strlen(string);
  local_30 = (char *)lrtr_malloc(sVar2 + 1);
  if (local_30 == (char *)0x0) {
    local_30 = (char *)0x0;
  }
  else {
    memcpy(local_30,string,sVar2 + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_30;
  }
  __stack_chk_fail();
}

Assistant:

char *lrtr_strdup(const char *string)
{
	assert(string);

	size_t length = strlen(string) + 1;
	char *new_string = lrtr_malloc(length);

	return new_string ? memcpy(new_string, string, length) : NULL;
}